

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayoutengine.cpp
# Opt level: O3

void __thiscall QGridLayoutRowInfo::insertOrRemoveRows(QGridLayoutRowInfo *this,int row,int delta)

{
  QList<QStretchParameter> *this_00;
  QList<QLayoutParameter<double>_> *this_01;
  QList<QFlags<Qt::AlignmentFlag>_> *this_02;
  QList<QGridLayoutBox> *this_03;
  Data *pDVar1;
  Data *pDVar2;
  Data *pDVar3;
  Data *pDVar4;
  int iVar5;
  int iVar6;
  long in_FS_OFFSET;
  QGridLayoutBox local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->count = this->count + delta;
  iVar5 = (int)(this->stretches).d.size;
  iVar6 = iVar5 - row;
  if (iVar6 == 0 || iVar5 < row) {
LAB_00535231:
    iVar5 = (int)(this->spacings).d.size;
    iVar6 = iVar5 - row;
    if (iVar6 != 0 && row <= iVar5) {
      this_01 = &this->spacings;
      if (delta < 1) {
        if (delta < 0) {
          iVar5 = -delta;
          if (SBORROW4(iVar6,-delta) != iVar6 + delta < 0) {
            iVar5 = iVar6;
          }
          pDVar2 = (this_01->d).d;
          if ((pDVar2 == (Data *)0x0) ||
             (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
            QArrayDataPointer<QLayoutParameter<double>_>::reallocateAndGrow
                      (&this_01->d,GrowsAtEnd,0,(QArrayDataPointer<QLayoutParameter<double>_> *)0x0)
            ;
          }
          QtPrivate::QMovableArrayOps<QLayoutParameter<double>_>::erase
                    ((QMovableArrayOps<QLayoutParameter<double>_> *)this_01,
                     (this->spacings).d.ptr + row,(long)iVar5);
        }
      }
      else {
        local_68.q_minimumSize = 0.0;
        local_68.q_preferredSize = (qreal)((ulong)local_68.q_preferredSize & 0xffffffff00000000);
        QtPrivate::QMovableArrayOps<QLayoutParameter<double>_>::insert
                  ((QMovableArrayOps<QLayoutParameter<double>_> *)this_01,(long)row,
                   (ulong)(uint)delta,(parameter_type)&local_68);
        QList<QLayoutParameter<double>_>::begin(this_01);
      }
    }
  }
  else {
    this_00 = &this->stretches;
    if (0 < delta) {
      local_68.q_minimumSize = 2.12199579047121e-314;
      QtPrivate::QMovableArrayOps<QStretchParameter>::insert
                ((QMovableArrayOps<QStretchParameter> *)this_00,(long)row,(ulong)(uint)delta,
                 (parameter_type)&local_68);
      QList<QStretchParameter>::begin(this_00);
      goto LAB_00535231;
    }
    if (delta < 0) {
      iVar5 = -delta;
      if (SBORROW4(iVar6,-delta) != iVar6 + delta < 0) {
        iVar5 = iVar6;
      }
      pDVar1 = (this_00->d).d;
      if ((pDVar1 == (Data *)0x0) ||
         (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QArrayDataPointer<QStretchParameter>::reallocateAndGrow
                  (&this_00->d,GrowsAtEnd,0,(QArrayDataPointer<QStretchParameter> *)0x0);
      }
      QtPrivate::QMovableArrayOps<QStretchParameter>::erase
                ((QMovableArrayOps<QStretchParameter> *)this_00,(this->stretches).d.ptr + row,
                 (long)iVar5);
      goto LAB_00535231;
    }
  }
  iVar5 = (int)(this->alignments).d.size;
  iVar6 = iVar5 - row;
  if (iVar6 != 0 && row <= iVar5) {
    this_02 = &this->alignments;
    if (delta < 1) {
      if (-1 < delta) goto LAB_00535413;
      iVar5 = -delta;
      if (SBORROW4(iVar6,-delta) != iVar6 + delta < 0) {
        iVar5 = iVar6;
      }
      pDVar3 = (this_02->d).d;
      if ((pDVar3 == (Data *)0x0) ||
         (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        QArrayDataPointer<QFlags<Qt::AlignmentFlag>_>::reallocateAndGrow
                  (&this_02->d,GrowsAtEnd,0,(QArrayDataPointer<QFlags<Qt::AlignmentFlag>_> *)0x0);
      }
      QtPrivate::QPodArrayOps<QFlags<Qt::AlignmentFlag>_>::erase
                ((QPodArrayOps<QFlags<Qt::AlignmentFlag>_> *)this_02,(this->alignments).d.ptr + row,
                 (long)iVar5);
    }
    else {
      local_68.q_minimumSize = (qreal)((ulong)local_68.q_minimumSize & 0xffffffff00000000);
      QtPrivate::QPodArrayOps<QFlags<Qt::AlignmentFlag>_>::insert
                ((QPodArrayOps<QFlags<Qt::AlignmentFlag>_> *)this_02,(long)row,(ulong)(uint)delta,
                 (parameter_type)&local_68);
      QList<QFlags<Qt::AlignmentFlag>_>::begin(this_02);
    }
  }
  iVar5 = (int)(this->boxes).d.size;
  iVar6 = iVar5 - row;
  if (iVar6 != 0 && row <= iVar5) {
    this_03 = &this->boxes;
    if (delta < 1) {
      if (delta < 0) {
        iVar5 = -delta;
        if (SBORROW4(iVar6,-delta) != iVar6 + delta < 0) {
          iVar5 = iVar6;
        }
        pDVar4 = (this_03->d).d;
        if ((pDVar4 == (Data *)0x0) ||
           (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QArrayDataPointer<QGridLayoutBox>::reallocateAndGrow
                    (&this_03->d,GrowsAtEnd,0,(QArrayDataPointer<QGridLayoutBox> *)0x0);
        }
        QtPrivate::QMovableArrayOps<QGridLayoutBox>::erase
                  ((QMovableArrayOps<QGridLayoutBox> *)this_03,(this->boxes).d.ptr + row,(long)iVar5
                  );
      }
    }
    else {
      local_68.q_minimumSize = 0.0;
      local_68.q_preferredSize = 0.0;
      local_68.q_maximumSize = 3.4028234663852886e+38;
      local_68.q_minimumDescent = -1.0;
      local_68.q_minimumAscent = -1.0;
      QtPrivate::QMovableArrayOps<QGridLayoutBox>::insert
                ((QMovableArrayOps<QGridLayoutBox> *)this_03,(long)row,(ulong)(uint)delta,&local_68)
      ;
      QList<QGridLayoutBox>::begin(this_03);
    }
  }
LAB_00535413:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGridLayoutRowInfo::insertOrRemoveRows(int row, int delta)
{
    count += delta;

    insertOrRemoveItems(stretches, row, delta);
    insertOrRemoveItems(spacings, row, delta);
    insertOrRemoveItems(alignments, row, delta);
    insertOrRemoveItems(boxes, row, delta);
}